

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O0

int __thiscall smf::MidiEventList::linkNotePairsFIFO(MidiEventList *this)

{
  allocator<smf::MidiEvent_*> *this_00;
  allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_> *this_01;
  MidiEvent *pMVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  reference ppMVar10;
  reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  reference ppMVar14;
  uint *puVar15;
  int contstate;
  int contval;
  int channel_2;
  int conti;
  int contnum;
  MidiEvent *noteon_1;
  int channel_1;
  int key_1;
  int channel;
  int key;
  MidiEvent *mev;
  int i;
  int counter;
  vector<int,_std::allocator<int>_> local_218;
  undefined1 local_200 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  oldstates;
  value_type local_1e0;
  vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> local_1d8;
  undefined1 local_1c0 [8];
  vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  contevents;
  int local_1a0;
  pair<int,_int> local_19c;
  int local_194 [2];
  pair<int,_int> local_18c;
  int local_184 [2];
  pair<int,_int> local_17c;
  int local_174 [2];
  pair<int,_int> local_16c;
  int local_164 [2];
  pair<int,_int> local_15c;
  int local_154 [2];
  pair<int,_int> local_14c;
  int local_144 [2];
  pair<int,_int> local_13c;
  int local_134 [2];
  pair<int,_int> local_12c;
  int local_124 [2];
  pair<int,_int> local_11c;
  int local_114 [2];
  pair<int,_int> local_10c;
  int local_104 [2];
  pair<int,_int> local_fc;
  int local_f4 [2];
  pair<int,_int> local_ec;
  int local_e4 [2];
  pair<int,_int> local_dc;
  int local_d4 [2];
  pair<int,_int> local_cc;
  int local_c4 [2];
  pair<int,_int> local_bc;
  int local_b4 [2];
  pair<int,_int> local_ac;
  int local_a4 [2];
  pair<int,_int> local_9c;
  int local_94 [2];
  pair<int,_int> local_8c;
  allocator<std::pair<int,_int>_> local_81;
  int local_80 [2];
  pair<int,_int> local_78;
  undefined1 local_70 [8];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> contmap;
  vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  *noteon;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  *__range1;
  undefined1 local_28 [8];
  vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  noteons;
  MidiEventList *this_local;
  
  noteons.
  super__Vector_base<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  ::vector((vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
            *)local_28);
  std::
  vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  ::resize((vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
            *)local_28,0x10);
  __end1 = std::
           vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
           ::begin((vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                    *)local_28);
  noteon = (vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
            *)std::
              vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
              ::end((vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                     *)local_28);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_*,_std::vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>_>
                                     *)&noteon), bVar2) {
    contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_*,_std::vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>_>
                  ::operator*(&__end1);
    std::
    vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
    ::resize((vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
              *)contmap.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,0x80);
    __gnu_cxx::
    __normal_iterator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_*,_std::vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>_>
    ::operator++(&__end1);
  }
  local_80[1] = 0;
  local_80[0] = 0;
  std::pair<int,_int>::pair<int,_int,_true>(&local_78,local_80 + 1,local_80);
  std::allocator<std::pair<int,_int>_>::allocator(&local_81);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70,0x80,
             &local_78,&local_81);
  std::allocator<std::pair<int,_int>_>::~allocator(&local_81);
  local_94[1] = 1;
  local_94[0] = 0;
  std::pair<int,_int>::pair<int,_int,_true>(&local_8c,local_94 + 1,local_94);
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70
                      ,0x40);
  std::pair<int,_int>::operator=(pvVar7,&local_8c);
  local_a4[1] = 1;
  local_a4[0] = 1;
  std::pair<int,_int>::pair<int,_int,_true>(&local_9c,local_a4 + 1,local_a4);
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70
                      ,0x41);
  std::pair<int,_int>::operator=(pvVar7,&local_9c);
  local_b4[1] = 1;
  local_b4[0] = 2;
  std::pair<int,_int>::pair<int,_int,_true>(&local_ac,local_b4 + 1,local_b4);
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70
                      ,0x42);
  std::pair<int,_int>::operator=(pvVar7,&local_ac);
  local_c4[1] = 1;
  local_c4[0] = 3;
  std::pair<int,_int>::pair<int,_int,_true>(&local_bc,local_c4 + 1,local_c4);
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70
                      ,0x43);
  std::pair<int,_int>::operator=(pvVar7,&local_bc);
  local_d4[1] = 1;
  local_d4[0] = 4;
  std::pair<int,_int>::pair<int,_int,_true>(&local_cc,local_d4 + 1,local_d4);
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70
                      ,0x44);
  std::pair<int,_int>::operator=(pvVar7,&local_cc);
  local_e4[1] = 1;
  local_e4[0] = 5;
  std::pair<int,_int>::pair<int,_int,_true>(&local_dc,local_e4 + 1,local_e4);
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70
                      ,0x45);
  std::pair<int,_int>::operator=(pvVar7,&local_dc);
  local_f4[1] = 1;
  local_f4[0] = 6;
  std::pair<int,_int>::pair<int,_int,_true>(&local_ec,local_f4 + 1,local_f4);
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70
                      ,0x50);
  std::pair<int,_int>::operator=(pvVar7,&local_ec);
  local_104[1] = 1;
  local_104[0] = 7;
  std::pair<int,_int>::pair<int,_int,_true>(&local_fc,local_104 + 1,local_104);
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70
                      ,0x51);
  std::pair<int,_int>::operator=(pvVar7,&local_fc);
  local_114[1] = 1;
  local_114[0] = 8;
  std::pair<int,_int>::pair<int,_int,_true>(&local_10c,local_114 + 1,local_114);
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70
                      ,0x52);
  std::pair<int,_int>::operator=(pvVar7,&local_10c);
  local_124[1] = 1;
  local_124[0] = 9;
  std::pair<int,_int>::pair<int,_int,_true>(&local_11c,local_124 + 1,local_124);
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70
                      ,0x53);
  std::pair<int,_int>::operator=(pvVar7,&local_11c);
  local_134[1] = 1;
  local_134[0] = 10;
  std::pair<int,_int>::pair<int,_int,_true>(&local_12c,local_134 + 1,local_134);
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70
                      ,0x54);
  std::pair<int,_int>::operator=(pvVar7,&local_12c);
  local_144[1] = 1;
  local_144[0] = 0xb;
  std::pair<int,_int>::pair<int,_int,_true>(&local_13c,local_144 + 1,local_144);
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70
                      ,0x55);
  std::pair<int,_int>::operator=(pvVar7,&local_13c);
  local_154[1] = 1;
  local_154[0] = 0xc;
  std::pair<int,_int>::pair<int,_int,_true>(&local_14c,local_154 + 1,local_154);
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70
                      ,0x56);
  std::pair<int,_int>::operator=(pvVar7,&local_14c);
  local_164[1] = 1;
  local_164[0] = 0xd;
  std::pair<int,_int>::pair<int,_int,_true>(&local_15c,local_164 + 1,local_164);
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70
                      ,0x57);
  std::pair<int,_int>::operator=(pvVar7,&local_15c);
  local_174[1] = 1;
  local_174[0] = 0xe;
  std::pair<int,_int>::pair<int,_int,_true>(&local_16c,local_174 + 1,local_174);
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70
                      ,0x58);
  std::pair<int,_int>::operator=(pvVar7,&local_16c);
  local_184[1] = 1;
  local_184[0] = 0xf;
  std::pair<int,_int>::pair<int,_int,_true>(&local_17c,local_184 + 1,local_184);
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70
                      ,0x59);
  std::pair<int,_int>::operator=(pvVar7,&local_17c);
  local_194[1] = 1;
  local_194[0] = 0x10;
  std::pair<int,_int>::pair<int,_int,_true>(&local_18c,local_194 + 1,local_194);
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70
                      ,0x5a);
  std::pair<int,_int>::operator=(pvVar7,&local_18c);
  local_1a0 = 1;
  contevents.
  super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x11;
  std::pair<int,_int>::pair<int,_int,_true>
            (&local_19c,&stack0xfffffffffffffe60,
             (int *)((long)&contevents.
                            super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70
                      ,0x7a);
  std::pair<int,_int>::operator=(pvVar7,&local_19c);
  local_1e0 = (value_type)0x0;
  this_00 = (allocator<smf::MidiEvent_*> *)
            ((long)&oldstates.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<smf::MidiEvent_*>::allocator(this_00);
  std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::vector
            (&local_1d8,0x10,&local_1e0,this_00);
  this_01 = (allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_> *)
            ((long)&oldstates.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 6);
  std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>::allocator
            (this_01);
  std::
  vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  ::vector((vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
            *)local_1c0,0x12,&local_1d8,this_01);
  std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>::~allocator
            ((allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_> *)
             ((long)&oldstates.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::~vector(&local_1d8);
  std::allocator<smf::MidiEvent_*>::~allocator
            ((allocator<smf::MidiEvent_*> *)
             ((long)&oldstates.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  counter = -1;
  std::allocator<int>::allocator((allocator<int> *)((long)&i + 3));
  std::vector<int,_std::allocator<int>_>::vector
            (&local_218,0x10,&counter,(allocator<int> *)((long)&i + 3));
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&i + 2));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_200,0x12,&local_218,
           (allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&i + 2));
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&i + 2));
  std::vector<int,_std::allocator<int>_>::~vector(&local_218);
  std::allocator<int>::~allocator((allocator<int> *)((long)&i + 3));
  mev._4_4_ = 0;
  for (mev._0_4_ = 0; iVar4 = (int)mev, iVar3 = getSize(this), iVar5 = mev._4_4_, iVar4 < iVar3;
      mev._0_4_ = (int)mev + 1) {
    _channel = getEvent(this,(int)mev);
    MidiEvent::unlinkEvent(_channel);
    bVar2 = MidiMessage::isNoteOn(&_channel->super_MidiMessage);
    if (bVar2) {
      iVar4 = MidiMessage::getKeyNumber(&_channel->super_MidiMessage);
      iVar5 = MidiMessage::getChannel(&_channel->super_MidiMessage);
      pvVar8 = std::
               vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                             *)local_28,(long)iVar5);
      pvVar9 = std::
               vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
               ::operator[](pvVar8,(long)iVar4);
      std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::push_back
                (pvVar9,(value_type *)&channel);
    }
    else {
      bVar2 = MidiMessage::isNoteOff(&_channel->super_MidiMessage);
      if (bVar2) {
        iVar4 = MidiMessage::getKeyNumber(&_channel->super_MidiMessage);
        iVar5 = MidiMessage::getChannel(&_channel->super_MidiMessage);
        pvVar8 = std::
                 vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                               *)local_28,(long)iVar5);
        pvVar9 = std::
                 vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                 ::operator[](pvVar8,(long)iVar4);
        bVar2 = std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::empty
                          (pvVar9);
        if (!bVar2) {
          pvVar8 = std::
                   vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                   ::operator[]((vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                                 *)local_28,(long)iVar5);
          pvVar9 = std::
                   vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                   ::operator[](pvVar8,(long)iVar4);
          ppMVar10 = std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::front
                               (pvVar9);
          pMVar1 = *ppMVar10;
          pvVar8 = std::
                   vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                   ::operator[]((vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                                 *)local_28,(long)iVar5);
          pvVar9 = std::
                   vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                   ::operator[](pvVar8,(long)iVar4);
          std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::pop_front(pvVar9)
          ;
          MidiEvent::linkEvent(pMVar1,_channel);
          mev._4_4_ = mev._4_4_ + 1;
        }
      }
      else {
        bVar2 = MidiMessage::isController(&_channel->super_MidiMessage);
        if (bVar2) {
          iVar4 = MidiMessage::getP1(&_channel->super_MidiMessage);
          pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                   operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              local_70,(long)iVar4);
          if (pvVar7->first != 0) {
            pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                     operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 *)local_70,(long)iVar4);
            iVar4 = pvVar7->second;
            iVar5 = MidiMessage::getChannel(&_channel->super_MidiMessage);
            iVar3 = MidiMessage::getP2(&_channel->super_MidiMessage);
            uVar6 = (uint)(0x3f < iVar3);
            pvVar11 = std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    *)local_200,(long)iVar4);
            pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](pvVar11,(long)iVar5);
            pMVar1 = _channel;
            if ((*pvVar12 == -1) && (uVar6 != 0)) {
              pvVar13 = std::
                        vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                        ::operator[]((vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                                      *)local_1c0,(long)iVar4);
              ppMVar14 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::
                         operator[](pvVar13,(long)iVar5);
              *ppMVar14 = pMVar1;
              pvVar11 = std::
                        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      *)local_200,(long)iVar4);
              puVar15 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                          (pvVar11,(long)iVar5);
              *puVar15 = uVar6;
            }
            else {
              pvVar11 = std::
                        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      *)local_200,(long)iVar4);
              puVar15 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                          (pvVar11,(long)iVar5);
              if (*puVar15 != uVar6) {
                pvVar11 = std::
                          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        *)local_200,(long)iVar4);
                pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](pvVar11,(long)iVar5);
                pMVar1 = _channel;
                if ((*pvVar12 == 0) && (uVar6 != 0)) {
                  pvVar13 = std::
                            vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                            ::operator[]((vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                                          *)local_1c0,(long)iVar4);
                  ppMVar14 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::
                             operator[](pvVar13,(long)iVar5);
                  *ppMVar14 = pMVar1;
                  pvVar11 = std::
                            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                          *)local_200,(long)iVar4);
                  puVar15 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                              (pvVar11,(long)iVar5);
                  *puVar15 = uVar6;
                }
                else {
                  pvVar11 = std::
                            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                          *)local_200,(long)iVar4);
                  pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](pvVar11,(long)iVar5);
                  if ((*pvVar12 == 1) && (uVar6 == 0)) {
                    pvVar13 = std::
                              vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                              ::operator[]((vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                                            *)local_1c0,(long)iVar4);
                    ppMVar14 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::
                               operator[](pvVar13,(long)iVar5);
                    MidiEvent::linkEvent(*ppMVar14,_channel);
                    pvVar11 = std::
                              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                            *)local_200,(long)iVar4);
                    pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                                        (pvVar11,(long)iVar5);
                    pMVar1 = _channel;
                    *pvVar12 = 0;
                    pvVar13 = std::
                              vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                              ::operator[]((vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                                            *)local_1c0,(long)iVar4);
                    ppMVar14 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::
                               operator[](pvVar13,(long)iVar5);
                    *ppMVar14 = pMVar1;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_200);
  std::
  vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  ::~vector((vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
             *)local_1c0);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70);
  std::
  vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
             *)local_28);
  return iVar5;
}

Assistant:

int MidiEventList::linkNotePairsFIFO(void) {
	// Note-on states:
	// dimension 1: MIDI channel (0-15)
	// dimension 2: MIDI key     (0-127)  (but 0 not used for note-ons)
	// dimension 3: List of active note-ons or note-offs (FIFO behavior).
	std::vector<std::vector<std::list<MidiEvent*>>> noteons;
	noteons.resize(16);
	for (auto& noteon : noteons) {
		noteon.resize(128);
	}

	// Controller linking: The following General MIDI controller numbers are
	// also monitored for linking within the track (but not between tracks).
	// hex dec  name                                    range
	// 40  64   Hold pedal (Sustain) on/off             0..63=off  64..127=on
	// 41  65   Portamento on/off                       0..63=off  64..127=on
	// 42  66   Sustenuto Pedal on/off                  0..63=off  64..127=on
	// 43  67   Soft Pedal on/off                       0..63=off  64..127=on
	// 44  68   Legato Pedal on/off                     0..63=off  64..127=on
	// 45  69   Hold Pedal 2 on/off                     0..63=off  64..127=on
	// 50  80   General Purpose Button                  0..63=off  64..127=on
	// 51  81   General Purpose Button                  0..63=off  64..127=on
	// 52  82   General Purpose Button                  0..63=off  64..127=on
	// 53  83   General Purpose Button                  0..63=off  64..127=on
	// 54  84   Undefined on/off                        0..63=off  64..127=on
	// 55  85   Undefined on/off                        0..63=off  64..127=on
	// 56  86   Undefined on/off                        0..63=off  64..127=on
	// 57  87   Undefined on/off                        0..63=off  64..127=on
	// 58  88   Undefined on/off                        0..63=off  64..127=on
	// 59  89   Undefined on/off                        0..63=off  64..127=on
	// 5A  90   Undefined on/off                        0..63=off  64..127=on
	// 7A 122   Local Keyboard On/Off                   0..63=off  64..127=on

	// first keep track of whether the controller is an on/off switch:
	std::vector<std::pair<int, int>> contmap(128, {0, 0});
	contmap[64] = {1, 0}; contmap[65] = {1, 1}; contmap[66] = {1, 2}; 
	contmap[67] = {1, 3}; contmap[68] = {1, 4}; contmap[69] = {1, 5};
	contmap[80] = {1, 6}; contmap[81] = {1, 7}; contmap[82] = {1, 8}; 
	contmap[83] = {1, 9}; contmap[84] = {1, 10}; contmap[85] = {1, 11};
	contmap[86] = {1, 12}; contmap[87] = {1, 13}; contmap[88] = {1, 14}; 
	contmap[89] = {1, 15}; contmap[90] = {1, 16}; contmap[122] = {1, 17};

	std::vector<std::vector<MidiEvent*>> contevents(18, std::vector<MidiEvent*>(16, nullptr));
	std::vector<std::vector<int>> oldstates(18, std::vector<int>(16, -1));

	int counter = 0;
	for (int i = 0; i < getSize(); i++) {
		MidiEvent* mev = &getEvent(i);
		mev->unlinkEvent();

		if (mev->isNoteOn()) {
			int key = mev->getKeyNumber();
			int channel = mev->getChannel();
			noteons[channel][key].push_back(mev);  // Enqueue (FIFO)
		} else if (mev->isNoteOff()) {
			int key = mev->getKeyNumber();
			int channel = mev->getChannel();
			if (!noteons[channel][key].empty()) {  // **Check before accessing**
				MidiEvent* noteon = noteons[channel][key].front(); // Safely access first event
				noteons[channel][key].pop_front(); // Remove first event (FIFO)
				noteon->linkEvent(mev);
				counter++;
			}
		} else if (mev->isController()) {
			int contnum = mev->getP1();
			if (contmap[contnum].first) {
				int conti = contmap[contnum].second;
				int channel = mev->getChannel();
				int contval = mev->getP2();
				int contstate = contval < 64 ? 0 : 1;

				if ((oldstates[conti][channel] == -1) && contstate) {
					contevents[conti][channel] = mev;
					oldstates[conti][channel] = contstate;
				} else if (oldstates[conti][channel] == contstate) {
					// Redundant controller state, ignore.
				} else if ((oldstates[conti][channel] == 0) && contstate) {
					contevents[conti][channel] = mev;
					oldstates[conti][channel] = contstate;
				} else if ((oldstates[conti][channel] == 1) && (contstate == 0)) {
					contevents[conti][channel]->linkEvent(mev);
					oldstates[conti][channel] = contstate;
					contevents[conti][channel] = mev;
				}
			}
		}
	}
	return counter;
}